

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenio::save_nodes(tetgenio *this,char *filebasename)

{
  double *pdVar1;
  int iVar2;
  FILE *pFVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  char outmtrfilename [1024];
  char outnodefilename [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  sprintf(local_438,"%s.node");
  printf("Saving nodes to %s\n",local_438);
  pFVar3 = fopen(local_438,"w");
  fprintf(pFVar3,"%d  %d  %d  %d\n",(ulong)(uint)this->numberofpoints,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  if (0 < this->numberofpoints) {
    lVar6 = 0;
    do {
      uVar4 = (ulong)(uint)(this->firstnumber + (int)lVar6);
      if (this->mesh_dim == 2) {
        fprintf(pFVar3,"%d  %.16g  %.16g",this->pointlist[lVar6 * 3],this->pointlist[lVar6 * 3 + 1],
                uVar4);
      }
      else {
        pdVar1 = this->pointlist;
        fprintf(pFVar3,"%d  %.16g  %.16g  %.16g",pdVar1[lVar6 * 3],pdVar1[lVar6 * 3 + 1],
                pdVar1[lVar6 * 3 + 2],uVar4);
      }
      iVar5 = this->numberofpointattributes;
      if (0 < iVar5) {
        lVar7 = 0;
        do {
          fprintf(pFVar3,"  %.16g",this->pointattributelist[iVar5 * (int)lVar6 + lVar7]);
          iVar5 = this->numberofpointattributes;
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 < iVar5);
      }
      if (this->pointmarkerlist != (int *)0x0) {
        fprintf(pFVar3,"  %d",(ulong)(uint)this->pointmarkerlist[lVar6]);
      }
      fputc(10,pFVar3);
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->numberofpoints);
  }
  fclose(pFVar3);
  if ((0 < this->numberofpointmtrs) && (this->pointmtrlist != (double *)0x0)) {
    iVar5 = 0;
    sprintf(local_838,"%s.mtr",filebasename);
    printf("Saving metrics to %s\n",local_838);
    pFVar3 = fopen(local_838,"w");
    fprintf(pFVar3,"%d  %d\n",(ulong)(uint)this->numberofpoints,(ulong)(uint)this->numberofpointmtrs
           );
    if (0 < this->numberofpoints) {
      do {
        iVar2 = this->numberofpointmtrs;
        if (0 < iVar2) {
          lVar6 = 0;
          do {
            fprintf(pFVar3,"%.16g ",this->pointmtrlist[iVar2 * iVar5 + lVar6]);
            iVar2 = this->numberofpointmtrs;
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 < iVar2);
        }
        fputc(10,pFVar3);
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->numberofpoints);
    }
    fclose(pFVar3);
  }
  return;
}

Assistant:

void tetgenio::save_nodes(char* filebasename)
{
  FILE *fout;
  char outnodefilename[FILENAMESIZE];
  char outmtrfilename[FILENAMESIZE];
  int i, j;

  sprintf(outnodefilename, "%s.node", filebasename);
  printf("Saving nodes to %s\n", outnodefilename);
  fout = fopen(outnodefilename, "w");
  fprintf(fout, "%d  %d  %d  %d\n", numberofpoints, mesh_dim,
          numberofpointattributes, pointmarkerlist != NULL ? 1 : 0);
  for (i = 0; i < numberofpoints; i++) {
    if (mesh_dim == 2) {
      fprintf(fout, "%d  %.16g  %.16g", i + firstnumber, pointlist[i * 3],
              pointlist[i * 3 + 1]);
    } else {
      fprintf(fout, "%d  %.16g  %.16g  %.16g", i + firstnumber,
              pointlist[i * 3], pointlist[i * 3 + 1], pointlist[i * 3 + 2]);
    }
    for (j = 0; j < numberofpointattributes; j++) {
      fprintf(fout, "  %.16g", 
              pointattributelist[i * numberofpointattributes + j]);
    }
    if (pointmarkerlist != NULL) {
      fprintf(fout, "  %d", pointmarkerlist[i]);
    }
    fprintf(fout, "\n");
  }
  fclose(fout);

  // If the point metrics exist, output them to a .mtr file.
  if ((numberofpointmtrs > 0) && (pointmtrlist != (REAL *) NULL)) {
    sprintf(outmtrfilename, "%s.mtr", filebasename);
    printf("Saving metrics to %s\n", outmtrfilename);
    fout = fopen(outmtrfilename, "w");
    fprintf(fout, "%d  %d\n", numberofpoints, numberofpointmtrs);
    for (i = 0; i < numberofpoints; i++) {
      for (j = 0; j < numberofpointmtrs; j++) {
        fprintf(fout, "%.16g ", pointmtrlist[i * numberofpointmtrs + j]);
      }
      fprintf(fout, "\n");
    }
    fclose(fout);
  }
}